

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::ElementsDecodeRawTransactionResponse::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>
  *in_stack_fffffffffffff748;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>
  *in_stack_fffffffffffff750;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse> *this;
  char (*in_stack_fffffffffffff758) [9];
  char (*__args) [5];
  function<void_(cfd::api::json::ElementsDecodeRawTransactionResponse_&,_const_UniValue_&)>
  *in_stack_fffffffffffff760;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
  *this_00;
  undefined1 local_6f1 [49];
  char local_6c0 [103];
  allocator local_659;
  string local_658 [32];
  _Base_ptr local_638;
  undefined1 local_630;
  allocator local_5c1;
  string local_5c0 [32];
  _Base_ptr local_5a0;
  undefined1 local_598;
  allocator local_529;
  string local_528 [32];
  _Base_ptr local_508;
  undefined1 local_500;
  allocator local_491;
  string local_490 [32];
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  string local_2c8 [32];
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  string local_230 [32];
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                   *)0x4adf83);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [5])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"txid",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [5])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"hash",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [6])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"wtxid",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [8])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"withash",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [8])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"version",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [5])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"size",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [6])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"vsize",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [7])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_508 = (_Base_ptr)pVar2.first._M_node;
    local_500 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"weight",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_5a0 = (_Base_ptr)pVar2.first._M_node;
    local_598 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"locktime",&local_5c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)in_stack_fffffffffffff758);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)
               in_stack_fffffffffffff758);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff758);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>_>_>_>
                        *)in_stack_fffffffffffff760,(char (*) [4])in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
    local_638 = (_Base_ptr)pVar2.first._M_node;
    local_630 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"vin",&local_659);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff750,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    __args = (char (*) [5])local_6c0;
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionResponse_const&)>
    ::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionResponse_&)>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionResponse_ptr
                *)__args);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff760,
               (_func_void_ElementsDecodeRawTransactionResponse_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff760,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::operator=
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff750);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>&>
                      (this_00,__args,in_stack_fffffffffffff750);
    local_6f1._33_8_ = pVar2.first._M_node;
    local_6f1[0x29] = pVar2.second;
    this = (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse> *)local_6f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_6f1 + 1),"vout",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)in_stack_fffffffffffff748);
    std::__cxx11::string::~string((string *)(local_6f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_6f1);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionResponse>::
    ~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void ElementsDecodeRawTransactionResponse::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<ElementsDecodeRawTransactionResponse> func_table;  // NOLINT

  func_table = {
    ElementsDecodeRawTransactionResponse::GetTxidString,
    ElementsDecodeRawTransactionResponse::SetTxidString,
    ElementsDecodeRawTransactionResponse::GetTxidFieldType,
  };
  json_mapper.emplace("txid", func_table);
  item_list.push_back("txid");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetHashString,
    ElementsDecodeRawTransactionResponse::SetHashString,
    ElementsDecodeRawTransactionResponse::GetHashFieldType,
  };
  json_mapper.emplace("hash", func_table);
  item_list.push_back("hash");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetWtxidString,
    ElementsDecodeRawTransactionResponse::SetWtxidString,
    ElementsDecodeRawTransactionResponse::GetWtxidFieldType,
  };
  json_mapper.emplace("wtxid", func_table);
  item_list.push_back("wtxid");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetWithashString,
    ElementsDecodeRawTransactionResponse::SetWithashString,
    ElementsDecodeRawTransactionResponse::GetWithashFieldType,
  };
  json_mapper.emplace("withash", func_table);
  item_list.push_back("withash");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetVersionString,
    ElementsDecodeRawTransactionResponse::SetVersionString,
    ElementsDecodeRawTransactionResponse::GetVersionFieldType,
  };
  json_mapper.emplace("version", func_table);
  item_list.push_back("version");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetSizeString,
    ElementsDecodeRawTransactionResponse::SetSizeString,
    ElementsDecodeRawTransactionResponse::GetSizeFieldType,
  };
  json_mapper.emplace("size", func_table);
  item_list.push_back("size");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetVsizeString,
    ElementsDecodeRawTransactionResponse::SetVsizeString,
    ElementsDecodeRawTransactionResponse::GetVsizeFieldType,
  };
  json_mapper.emplace("vsize", func_table);
  item_list.push_back("vsize");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetWeightString,
    ElementsDecodeRawTransactionResponse::SetWeightString,
    ElementsDecodeRawTransactionResponse::GetWeightFieldType,
  };
  json_mapper.emplace("weight", func_table);
  item_list.push_back("weight");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetLocktimeString,
    ElementsDecodeRawTransactionResponse::SetLocktimeString,
    ElementsDecodeRawTransactionResponse::GetLocktimeFieldType,
  };
  json_mapper.emplace("locktime", func_table);
  item_list.push_back("locktime");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetVinString,
    ElementsDecodeRawTransactionResponse::SetVinString,
    ElementsDecodeRawTransactionResponse::GetVinFieldType,
  };
  json_mapper.emplace("vin", func_table);
  item_list.push_back("vin");
  func_table = {
    ElementsDecodeRawTransactionResponse::GetVoutString,
    ElementsDecodeRawTransactionResponse::SetVoutString,
    ElementsDecodeRawTransactionResponse::GetVoutFieldType,
  };
  json_mapper.emplace("vout", func_table);
  item_list.push_back("vout");
}